

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.c
# Opt level: O1

Color trace_ray(Scene *sc,Ray r,int depth,Sampler *sampler)

{
  Object obj;
  long lVar1;
  undefined8 *puVar2;
  Intersect *pIVar3;
  undefined8 *puVar4;
  long lVar5;
  ulong uVar6;
  byte bVar7;
  float fVar8;
  Color CVar11;
  Intersect it;
  Intersect in_stack_ffffffffffffff18;
  Material *in_stack_ffffffffffffff68;
  Intersect local_78;
  float fVar9;
  float fVar10;
  
  bVar7 = 0;
  local_78.hit = false;
  local_78.t = INFINITY;
  local_78.depth = depth;
  local_78.sampler = sampler;
  sampler->current_depth = (long)depth;
  if (sc->object_count != 0) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      puVar2 = (undefined8 *)((long)&sc->objects->kind + lVar5);
      puVar4 = (undefined8 *)&stack0xffffffffffffff18;
      for (lVar1 = 0xb; lVar1 != 0; lVar1 = lVar1 + -1) {
        *puVar4 = *puVar2;
        puVar2 = puVar2 + (ulong)bVar7 * -2 + 1;
        puVar4 = puVar4 + (ulong)bVar7 * -2 + 1;
      }
      obj.material = in_stack_ffffffffffffff68;
      obj._0_80_ = in_stack_ffffffffffffff18;
      intersect_object(obj,r,&local_78);
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x58;
    } while (uVar6 < sc->object_count);
  }
  if (local_78.hit == false) {
    CVar11 = gray(0.0);
    fVar10 = CVar11.b;
    fVar8 = CVar11.r;
    fVar9 = CVar11.g;
  }
  else {
    pIVar3 = &local_78;
    puVar2 = (undefined8 *)&stack0xffffffffffffff18;
    for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
      *puVar2 = *(undefined8 *)pIVar3;
      pIVar3 = (Intersect *)((long)pIVar3 + ((ulong)bVar7 * -2 + 1) * 8);
      puVar2 = puVar2 + (ulong)bVar7 * -2 + 1;
    }
    CVar11 = shade(in_stack_ffffffffffffff18,sc);
    fVar10 = CVar11.b;
    fVar8 = CVar11.r;
    fVar9 = CVar11.g;
  }
  CVar11.g = fVar9;
  CVar11.r = fVar8;
  CVar11.b = fVar10;
  return CVar11;
}

Assistant:

Color trace_ray(Scene* sc, Ray r, int depth, Sampler* sampler) {
    Intersect it;
    it.hit = false;
    it.t = INFINITY;
    it.depth = depth;
    it.sampler = sampler;
    sampler->current_depth = depth;

    for (int i = 0; i < sc->object_count; i++) {
        intersect_object(sc->objects[i], r, &it);
    }

    Color rval;

    if (it.hit) {
        rval = shade(it, sc);
    } else {
        rval = gray(0.0f); // @Todo : color constants
    }
    return rval;
}